

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffpkyc(fitsfile *fptr,char *keyname,float *value,int decim,char *comm,int *status)

{
  size_t sVar1;
  size_t sVar2;
  char valstring [71];
  char tmpstring [71];
  char card [81];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  local_128[0] = '(';
  local_128[1] = '\0';
  ffr2e(*value,decim,local_d8,status);
  sVar1 = strlen(local_128);
  sVar2 = strlen(local_d8);
  if (0xffffffffffffffb8 < (sVar2 + sVar1) - 0x45) {
    strcat(local_128,local_d8);
    sVar1 = strlen(local_128);
    (local_128 + sVar1)[0] = ',';
    (local_128 + sVar1)[1] = ' ';
    local_128[sVar1 + 2] = '\0';
    ffr2e(value[1],decim,local_d8,status);
    sVar1 = strlen(local_128);
    sVar2 = strlen(local_d8);
    if (0xffffffffffffffb8 < (sVar2 + sVar1) - 0x46) {
      strcat(local_128,local_d8);
      sVar1 = strlen(local_128);
      (local_128 + sVar1)[0] = ')';
      (local_128 + sVar1)[1] = '\0';
      ffmkky(keyname,local_128,comm,local_88,status);
      ffprec(fptr,local_88,status);
      return *status;
    }
  }
  ffpmsg("Error converting complex to string (ffpkyc)");
  *status = 0x192;
  return 0x192;
}

Assistant:

int ffpkyc( fitsfile *fptr,      /* I - FITS file pointer                   */
            const char  *keyname,/* I - name of keyword to write            */
            float *value,        /* I - keyword value (real, imaginary)     */
            int   decim,         /* I - number of decimal places to display */
            const char  *comm,   /* I - keyword comment                     */
            int   *status)       /* IO - error status                       */
/*
  Write (put) the keyword, value and comment into the FITS header.
  Writes an complex float keyword value. Format = (realvalue, imagvalue)
*/
{
    char valstring[FLEN_VALUE], tmpstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    strcpy(valstring, "(" );
    ffr2e(value[0], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring)+strlen(tmpstring)+2 > FLEN_VALUE-1)
    {
       ffpmsg("Error converting complex to string (ffpkyc)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ", ");
    ffr2e(value[1], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring)+strlen(tmpstring)+1 > FLEN_VALUE-1)
    {
       ffpmsg("Error converting complex to string (ffpkyc)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ")");

    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffprec(fptr, card, status);  /* write the keyword*/

    return(*status);
}